

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  size_type sVar1;
  const_reference pcVar2;
  long lVar3;
  byte *pbVar4;
  long lVar5;
  size_type sVar6;
  long lVar7;
  string_view str_local;
  string valid_str;
  
  str_local.size_ = str.size_;
  str_local.data_ = str.data_;
  if ((str_local.size_ == 0) ||
     (pcVar2 = string_view::front(&str_local), sVar1 = str_local.size_, *pcVar2 != '$')) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wat-writer.cc"
                  ,0x133,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(string_view, NextChar)");
  }
  lVar7 = 0;
  lVar5 = 0;
  for (lVar3 = (long)str_local.size_ >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((anonymous_namespace)::s_valid_name_chars[(byte)str_local.data_[lVar7 * 4]] == '\0') {
      pbVar4 = (byte *)(str_local.data_ + -lVar5);
      goto LAB_001734f9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)str_local.data_[lVar7 * 4 + 1]] == '\0') {
      pbVar4 = (byte *)(str_local.data_ + (1 - lVar5));
      goto LAB_001734f9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)str_local.data_[lVar7 * 4 + 2]] == '\0') {
      pbVar4 = (byte *)(str_local.data_ + (2 - lVar5));
      goto LAB_001734f9;
    }
    if ((anonymous_namespace)::s_valid_name_chars[(byte)str_local.data_[lVar7 * 4 + 3]] == '\0') {
      pbVar4 = (byte *)(str_local.data_ + (3 - lVar5));
      goto LAB_001734f9;
    }
    lVar5 = lVar5 + -4;
    lVar7 = lVar7 + 1;
  }
  pbVar4 = (byte *)(str_local.data_ + -lVar5);
  lVar3 = str_local.size_ + lVar5;
  if (lVar3 == 1) {
LAB_0017359b:
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar4] == '\0') goto LAB_001734f9;
  }
  else {
    if (lVar3 == 3) {
      if ((anonymous_namespace)::s_valid_name_chars[(byte)str_local.data_[lVar7 * 4]] != '\0') {
        pbVar4 = (byte *)(str_local.data_ + (1 - lVar5));
        goto LAB_0017358b;
      }
    }
    else {
      if (lVar3 != 2) goto LAB_001735a8;
LAB_0017358b:
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar4] != '\0') {
        pbVar4 = pbVar4 + 1;
        goto LAB_0017359b;
      }
    }
LAB_001734f9:
    if (pbVar4 != (byte *)(str_local.data_ + str_local.size_)) {
      valid_str._M_dataplus._M_p = (pointer)&valid_str.field_2;
      valid_str._M_string_length = 0;
      valid_str.field_2._M_local_buf[0] = '\0';
      for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
        std::__cxx11::string::push_back((char)&valid_str);
      }
      WriteDataWithNextChar(this,valid_str._M_dataplus._M_p,valid_str._M_string_length);
      std::__cxx11::string::_M_dispose();
      goto LAB_001735b6;
    }
  }
LAB_001735a8:
  WriteDataWithNextChar(this,str_local.data_,str_local.size_);
LAB_001735b6:
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteName(string_view str, NextChar next_char) {
  // Debug names must begin with a $ for for wast file to be valid
  assert(!str.empty() && str.front() == '$');
  bool has_invalid_chars = std::any_of(
      str.begin(), str.end(), [](uint8_t c) { return !s_valid_name_chars[c]; });

  if (has_invalid_chars) {
    std::string valid_str;
    std::transform(str.begin(), str.end(), std::back_inserter(valid_str),
                   [](uint8_t c) { return s_valid_name_chars[c] ? c : '_'; });
    WriteDataWithNextChar(valid_str.data(), valid_str.length());
  } else {
    WriteDataWithNextChar(str.data(), str.length());
  }

  next_char_ = next_char;
}